

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

qsizetype QtPrivate::QStringList_indexOf(QStringList *that,QRegularExpression *re,qsizetype from)

{
  bool bVar1;
  QFlagsStorage<QRegularExpression::PatternOption> QVar2;
  qsizetype qVar3;
  longlong *plVar4;
  long in_RDX;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  QRegularExpressionMatch m;
  QRegularExpression exactRe;
  QString exactPattern;
  undefined4 in_stack_ffffffffffffff08;
  MatchOption in_stack_ffffffffffffff0c;
  QList<QString> *in_stack_ffffffffffffff10;
  QRegularExpression *in_stack_ffffffffffffff18;
  QString *in_stack_ffffffffffffff28;
  QString *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  QFlagsStorage<QRegularExpression::PatternOption> options;
  MatchType in_stack_ffffffffffffff5c;
  uint uVar5;
  longlong offset;
  undefined4 in_stack_ffffffffffffff6c;
  QRegularExpression *in_stack_ffffffffffffff70;
  longlong local_88;
  qsizetype local_70;
  QFlagsStorage<QRegularExpression::MatchOption> in_stack_ffffffffffffff9c;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = in_RDX;
  if (in_RDX < 0) {
    qVar3 = QList<QString>::size(in_RDI);
    local_10 = in_RDX + qVar3;
    local_18 = 0;
    plVar4 = qMax<long_long>(&local_10,&local_18);
    local_88 = *plVar4;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  options.i = (Int)((ulong)local_50 >> 0x20);
  QRegularExpression::pattern(in_stack_ffffffffffffff18);
  QRegularExpression::anchoredPattern(in_stack_ffffffffffffff28);
  QString::~QString((QString *)0x54b932);
  QVar2.i = (Int)QRegularExpression::patternOptions((QRegularExpression *)in_stack_ffffffffffffff10)
  ;
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)CONCAT44(QVar2.i,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38,(PatternOptions)options.i);
  while (offset = local_88, qVar3 = QList<QString>::size(in_RDI), local_88 < qVar3) {
    QList<QString>::at(in_stack_ffffffffffffff10,
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    QRegularExpression::match
              (in_stack_ffffffffffffff70,(QString *)CONCAT44(in_stack_ffffffffffffff6c,QVar2.i),
               offset,in_stack_ffffffffffffff5c,(MatchOptions)in_stack_ffffffffffffff9c.i);
    bVar1 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)0x54ba1e);
    qVar3 = offset;
    if (!bVar1) {
      qVar3 = local_70;
    }
    local_70 = qVar3;
    uVar5 = (uint)bVar1;
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x54bad3);
    if (uVar5 != 0) goto LAB_0054bb06;
    local_88 = offset + 1;
    in_stack_ffffffffffffff5c = NormalMatch;
  }
  local_70 = -1;
LAB_0054bb06:
  QRegularExpression::~QRegularExpression((QRegularExpression *)0x54bb13);
  QString::~QString((QString *)0x54bb20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_70;
}

Assistant:

qsizetype QtPrivate::QStringList_indexOf(const QStringList *that, const QRegularExpression &re, qsizetype from)
{
    if (from < 0)
        from = qMax(from + that->size(), qsizetype(0));

    QString exactPattern = QRegularExpression::anchoredPattern(re.pattern());
    QRegularExpression exactRe(exactPattern, re.patternOptions());

    for (qsizetype i = from; i < that->size(); ++i) {
        QRegularExpressionMatch m = exactRe.match(that->at(i));
        if (m.hasMatch())
            return i;
    }
    return -1;
}